

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

Result<wallet::SelectionResult> * wallet::ErrorMaxWeightExceeded(void)

{
  long lVar1;
  Result<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  Error *in_stack_ffffffffffffff78;
  Result<wallet::SelectionResult> *this;
  ConstevalStringLiteral in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  ::_(in_stack_ffffffffffffffc8);
  util::Result<wallet::SelectionResult>::Result(this,(Error *)in_RDI);
  util::Error::~Error(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> ErrorMaxWeightExceeded()
{
    return util::Error{_("The inputs size exceeds the maximum weight. "
                         "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
}